

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

NetAliasSyntax * __thiscall slang::parsing::Parser::parseNetAlias(Parser *this,AttrList attributes)

{
  Token keyword;
  bool bVar1;
  int iVar2;
  SourceLocation location;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  NetAliasSyntax *pNVar4;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind kind;
  Token TVar5;
  Token TVar6;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_1a8;
  Info *local_198;
  undefined8 local_190;
  pointer local_188;
  size_t local_180;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  undefined1 local_140 [16];
  SyntaxNode *local_130;
  SyntaxNode *pSStack_128;
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_180 = (size_t)attributes._M_extent._M_extent_value;
  local_188 = attributes._M_ptr;
  TVar5 = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&local_1a8);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  local_140 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_140._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location((Token *)local_140);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,location);
    }
    local_1a8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrEquals(local_140._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_140,Semicolon,&local_1a8,(DiagCode)0x10001);
      src = extraout_RDX_03;
      keyword = TVar5;
      goto LAB_003c0a0c;
    }
    do {
      local_198 = TVar5.info;
      local_190 = TVar5._0_8_;
      pEVar3 = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar3;
      local_168 = CONCAT71(local_168._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_178._M_first);
      TVar6 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar6.kind);
      iVar2 = 3;
      src = extraout_RDX;
      if (TVar6.kind == Equals && !bVar1) {
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Equals);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar6 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar6.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if ((local_140._0_2_ == kind) && ((Info *)local_140._8_8_ == TVar6.info)) {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrEquals,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x10001,true);
            src = extraout_RDX_02;
            if (!bVar1) goto LAB_003c09b4;
          }
          iVar2 = 0;
          local_140 = (undefined1  [16])TVar6;
        }
      }
LAB_003c09b4:
      TVar5.info = local_198;
      TVar5.kind = (undefined2)local_190;
      TVar5._2_1_ = local_190._2_1_;
      TVar5.numFlags.raw = local_190._3_1_;
      TVar5.rawLen = local_190._4_4_;
    } while (iVar2 == 0);
    keyword.info = local_198;
    keyword.kind = (undefined2)local_190;
    keyword._2_1_ = local_190._2_1_;
    keyword.numFlags.raw = local_190._3_1_;
    keyword.rawLen = local_190._4_4_;
    TVar5.kind = (undefined2)local_190;
    TVar5._2_1_ = local_190._2_1_;
    TVar5.numFlags.raw = local_190._3_1_;
    TVar5.rawLen = local_190._4_4_;
    if (iVar2 != 3) goto LAB_003c0a0c;
    local_1a8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_1a8.info;
  keyword = TVar5;
LAB_003c0a0c:
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = local_180;
  local_150 = local_188;
  local_148 = local_180;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005e5c48;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar2);
  local_140._8_4_ = 3;
  local_130 = (SyntaxNode *)0x0;
  pSStack_128 = (SyntaxNode *)0x0;
  local_140._0_8_ = &PTR_getChild_005e62d0;
  pNVar4 = slang::syntax::SyntaxFactory::netAlias
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_178._M_first,
                      keyword,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_140,
                      local_1a8);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pNVar4;
}

Assistant:

NetAliasSyntax& Parser::parseNetAlias(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrEquals, isSemicolon>(
        buffer, TokenKind::Semicolon, TokenKind::Equals, semi, RequireItems::True,
        diag::ExpectedExpression,
        [this] { return &parsePrimaryExpression(ExpressionOptions::None); });

    return factory.netAlias(attributes, keyword, buffer.copy(alloc), semi);
}